

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void __thiscall xlib::Log::Format<int>(Log *this,string *format,int *first)

{
  ulong uVar1;
  string asStack_1b8 [32];
  ostringstream oss;
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x1222e2);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::ostream::operator<<((ostream *)&oss,*first);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(string *)0x2);
    std::__cxx11::string::~string(asStack_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }